

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O0

LanguagePtr Omega_h::yaml::ask_language(void)

{
  int iVar1;
  long lVar2;
  Language *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  LanguagePtr LVar3;
  
  if (ask_language()::ptr == '\0') {
    iVar1 = __cxa_guard_acquire(&ask_language()::ptr);
    if (iVar1 != 0) {
      __cxa_atexit(std::shared_ptr<Omega_h::Language>::~shared_ptr,&ask_language::ptr,&__dso_handle)
      ;
      __cxa_guard_release(&ask_language()::ptr);
    }
  }
  lVar2 = std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&ask_language::ptr.
                      super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>);
  if (lVar2 == 0) {
    __p = (Language *)operator_new(0x30);
    build_language();
    std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::Language>
              (&ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>,
               __p);
  }
  std::shared_ptr<Omega_h::Language>::shared_ptr
            ((shared_ptr<Omega_h::Language> *)in_RDI,&ask_language::ptr);
  LVar3.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar3.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (LanguagePtr)LVar3.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LanguagePtr ask_language() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static LanguagePtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    ptr.reset(new Language(build_language()));
  }
  return ptr;
}